

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

type * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as<(anonymous_namespace)::ns::Project<std::vector<(anonymous_namespace)::ns::Value,std::allocator<(anonymous_namespace)::ns::Value>>>>
          (type *__return_storage_ptr__,
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pVVar3;
  pointer pVVar4;
  bool bVar5;
  int iVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar7;
  _Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  *this_00;
  pointer pVVar8;
  iterator this_01;
  system_error *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pVVar11;
  string_view_type *key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  const_array_range_type cVar14;
  error_code __ec;
  error_code __ec_00;
  type local_88;
  vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  local_58;
  string_view_type local_40;
  
  bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (!bVar5) {
    psVar9 = (system_error *)__cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)&local_58,conversion_failed)
    ;
    local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Not a ns::Project","");
    __ec._0_8_ = (ulong)local_58.
                        super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff;
    *(undefined ***)(psVar9 + 0x50) = &PTR__json_exception_00b58738;
    __ec._M_cat = (error_category *)
                  local_58.
                  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    std::system_error::system_error(psVar9,__ec,&local_88.name);
    *(undefined8 *)psVar9 = 0xb5b5d8;
    *(undefined8 *)(psVar9 + 0x50) = 0xb5b610;
    *(undefined8 *)(psVar9 + 0x20) = 0;
    *(undefined8 *)(psVar9 + 0x28) = 0;
    *(system_error **)(psVar9 + 0x30) = psVar9 + 0x40;
    *(undefined8 *)(psVar9 + 0x38) = 0;
    psVar9[0x40] = (system_error)0x0;
    __cxa_throw(psVar9,&conv_error::typeinfo,conv_error::~conv_error);
  }
  __return_storage_ptr__->version = 1;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->author)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->author).field_2;
  (__return_storage_ptr__->author)._M_string_length = 0;
  (__return_storage_ptr__->author).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->notes)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->notes).field_2;
  (__return_storage_ptr__->notes)._M_string_length = 0;
  (__return_storage_ptr__->notes).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->showNotes = false;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.name._M_dataplus._M_p = (pointer)0x7;
  local_88.name._M_string_length = 0x8e9f4b;
  bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar5) {
    local_88.name._M_dataplus._M_p = (pointer)0x7;
    local_88.name._M_string_length = 0x8e9f4b;
    pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)&local_88);
    iVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<int>
                      (pbVar7);
    __return_storage_ptr__->version = iVar6;
  }
  local_88.name._M_dataplus._M_p = (pointer)0x4;
  local_88.name._M_string_length = 0x96ea5b;
  bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar5) {
    local_88.name._M_dataplus._M_p = (pointer)0x4;
    local_88.name._M_string_length = 0x96ea5b;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->name);
  }
  local_88.name._M_dataplus._M_p = &DAT_00000006;
  local_88.name._M_string_length = 0x8f85ee;
  bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar5) {
    local_88.name._M_dataplus._M_p = &DAT_00000006;
    local_88.name._M_string_length = 0x8f85ee;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->author);
  }
  local_88.name._M_dataplus._M_p = &DAT_00000005;
  local_88.name._M_string_length = 0x94b1f2;
  bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar5) {
    local_88.name._M_dataplus._M_p = &DAT_00000005;
    local_88.name._M_string_length = 0x94b1f2;
    json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    set_udt_member<std::__cxx11::string>
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               (string_view_type *)&local_88,&__return_storage_ptr__->notes);
  }
  local_88.name._M_dataplus._M_p = (pointer)0x9;
  local_88.name._M_string_length = 0x94b1f8;
  bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar5) {
    local_88.name._M_dataplus._M_p = (pointer)0x9;
    local_88.name._M_string_length = 0x94b1f8;
    pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                        (string_view_type *)&local_88);
    bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(pbVar7);
    __return_storage_ptr__->showNotes = bVar5;
  }
  local_88.name._M_dataplus._M_p = &DAT_00000006;
  local_88.name._M_string_length = 0x879d8b;
  bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::contains
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                     (string_view_type *)&local_88);
  if (bVar5) {
    key = &local_40;
    local_40._M_len = 6;
    local_40._M_str = "values";
    pbVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                       ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,key
                       );
    bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(pbVar7);
    if (!bVar5) {
      psVar9 = (system_error *)__cxa_allocate_exception(0x58);
      std::error_code::error_code<jsoncons::conv_errc,void>((error_code *)&local_88,not_vector);
      __ec_00._0_8_ = (ulong)local_88.name._M_dataplus._M_p & 0xffffffff;
      *(undefined ***)(psVar9 + 0x50) = &PTR__json_exception_00b58738;
      __ec_00._M_cat = (error_category *)local_88.name._M_string_length;
      std::system_error::system_error(psVar9,__ec_00);
      *(undefined8 *)psVar9 = 0xb5b5d8;
      *(undefined8 *)(psVar9 + 0x50) = 0xb5b610;
      *(undefined8 *)(psVar9 + 0x20) = 0;
      *(undefined8 *)(psVar9 + 0x28) = 0;
      *(system_error **)(psVar9 + 0x30) = psVar9 + 0x40;
      *(undefined8 *)(psVar9 + 0x38) = 0;
      psVar9[0x40] = (system_error)0x0;
      __cxa_throw(psVar9,&conv_error::typeinfo,conv_error::~conv_error);
    }
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = (_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               *)basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(pbVar7);
    pVVar4 = local_58.
             super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar3 = local_58.
             super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         *)0x333333333333333 < this_00) {
      std::__throw_length_error("vector::reserve");
    }
    uVar13 = (long)local_58.
                   super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_58.
                   super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if ((_Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         *)(((long)uVar13 >> 3) * -0x3333333333333333) < this_00) {
      pVVar8 = std::
               _Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               ::_M_allocate(this_00,(size_t)key);
      if (pVVar3 != pVVar4) {
        paVar12 = &(pVVar8->name).field_2;
        paVar10 = &(pVVar3->name).field_2;
        do {
          (((string *)(paVar12 + -1))->_M_dataplus)._M_p = (pointer)paVar12;
          pcVar1 = (((string *)(paVar10 + -1))->_M_dataplus)._M_p;
          if (paVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1) {
            sVar2 = *(size_type *)((long)paVar10 + 8);
            paVar12->_M_allocated_capacity = paVar10->_M_allocated_capacity;
            *(size_type *)((long)paVar12 + 8) = sVar2;
          }
          else {
            (((string *)(paVar12 + -1))->_M_dataplus)._M_p = pcVar1;
            paVar12->_M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          *(size_type *)((long)paVar12 + -8) = *(size_type *)((long)paVar10 + -8);
          (((string *)(paVar10 + -1))->_M_dataplus)._M_p = (pointer)paVar10;
          *(size_type *)((long)paVar10 + -8) = 0;
          paVar10->_M_local_buf[0] = '\0';
          *(undefined4 *)(paVar12 + 1) = *(undefined4 *)(paVar10 + 1);
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar12 + 0x28);
          pVVar11 = (pointer)((long)paVar10 + 0x18);
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar10 + 0x28);
        } while (pVVar11 != pVVar4);
      }
      if (pVVar3 != (pointer)0x0) {
        operator_delete(pVVar3,uVar13);
      }
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((long)pVVar4 - (long)pVVar3) + (long)pVVar8);
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pVVar8 + (long)this_00;
      local_58.
      super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
      ._M_impl.super__Vector_impl_data._M_start = pVVar8;
    }
    cVar14 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(pbVar7);
    this_01 = cVar14.first_._M_current;
    if (this_01._M_current != cVar14.last_._M_current._M_current) {
      do {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
        as<(anonymous_namespace)::ns::Value>(&local_88,this_01._M_current);
        std::
        vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
        ::push_back(&local_58,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.name._M_dataplus._M_p != &local_88.name.field_2) {
          operator_delete(local_88.name._M_dataplus._M_p,
                          local_88.name.field_2._M_allocated_capacity + 1);
        }
        this_01._M_current = this_01._M_current + 1;
      } while (this_01._M_current != cVar14.last_._M_current._M_current);
    }
    local_88.name._M_dataplus._M_p =
         (pointer)(__return_storage_ptr__->values).
                  super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_88.name._M_string_length =
         (size_type)
         (__return_storage_ptr__->values).
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_88.name.field_2._M_allocated_capacity =
         (size_type)
         (__return_storage_ptr__->values).
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::~vector((vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
               *)&local_88);
    std::vector<(anonymous_namespace)::ns::Value,_std::allocator<(anonymous_namespace)::ns::Value>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }